

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_handle_lifetime.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZESHandleLifetimeValidation::zesFabricPortGetMultiPortThroughputPrologue
          (ZESHandleLifetimeValidation *this,zes_device_handle_t hDevice,uint32_t numPorts,
          zes_fabric_port_handle_t *phPort,zes_fabric_port_throughput_t **pThroughput)

{
  long lVar1;
  bool bVar2;
  ze_result_t zVar3;
  ulong uVar4;
  
  lVar1 = context;
  bVar2 = HandleLifetimeValidation::isHandleValid
                    (*(HandleLifetimeValidation **)(context + 0xd48),hDevice);
  zVar3 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar2) {
    if (numPorts != 0 && phPort != (zes_fabric_port_handle_t *)0x0) {
      uVar4 = 1;
      do {
        bVar2 = HandleLifetimeValidation::isHandleValid
                          (*(HandleLifetimeValidation **)(lVar1 + 0xd48),phPort[uVar4 - 1]);
        if (!bVar2) {
          return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
      } while ((phPort != (zes_fabric_port_handle_t *)0x0) &&
              (bVar2 = uVar4 < numPorts, uVar4 = uVar4 + 1, bVar2));
    }
    zVar3 = ZE_RESULT_SUCCESS;
  }
  return zVar3;
}

Assistant:

ze_result_t
    ZESHandleLifetimeValidation::zesFabricPortGetMultiPortThroughputPrologue(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t numPorts,                              ///< [in] Number of ports enumerated in function ::zesDeviceEnumFabricPorts
        zes_fabric_port_handle_t* phPort,               ///< [in][range(0, numPorts)] array of fabric port handles provided by user
                                                        ///< to gather throughput values. 
        zes_fabric_port_throughput_t** pThroughput      ///< [out][range(0, numPorts)] array of fabric port throughput counters
                                                        ///< from multiple ports of type ::zes_fabric_port_throughput_t.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phPort) && (i < numPorts); ++i){
            if (!context.handleLifetime->isHandleValid( phPort[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }